

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O3

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatDouble
          (LocalizedNumberFormatter *this,double value,UErrorCode *status)

{
  DecimalQuantity *this_00;
  UNumberCompactStyle UVar1;
  UFormattedNumberData *results;
  UNumberCompactStyle *in_RDX;
  UNumberCompactStyle *extraout_RDX;
  UNumberCompactStyle *extraout_RDX_00;
  UNumberCompactStyle *extraout_RDX_01;
  UFormattedNumberData *p;
  FormattedNumber FVar2;
  
  if ((int)*in_RDX < U_ILLEGAL_ARGUMENT_ERROR) {
    results = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,(size_t)status);
    if (results == (UFormattedNumberData *)0x0) {
      *in_RDX = 7;
      UVar1 = 7;
      in_RDX = extraout_RDX;
    }
    else {
      memset(results,0,0x158);
      results->fMagic = 0x46444e00;
      this_00 = &results->quantity;
      impl::DecimalQuantity::DecimalQuantity(this_00);
      impl::NumberStringBuilder::NumberStringBuilder(&results->string);
      impl::DecimalQuantity::setToDouble(this_00,value);
      p = results;
      formatImpl((LocalizedNumberFormatter *)status,results,(UErrorCode *)in_RDX);
      if ((int)*in_RDX < U_ILLEGAL_ARGUMENT_ERROR) {
        UVar1 = UNUM_SHORT;
        in_RDX = extraout_RDX_00;
        goto LAB_002a08d5;
      }
      impl::NumberStringBuilder::~NumberStringBuilder(&results->string);
      impl::DecimalQuantity::~DecimalQuantity(this_00);
      UMemory::operator_delete((UMemory *)results,p);
      UVar1 = *in_RDX;
      in_RDX = extraout_RDX_01;
    }
  }
  else {
    UVar1 = UNUM_LONG;
  }
  results = (UFormattedNumberData *)0x0;
LAB_002a08d5:
  *(UFormattedNumberData **)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros =
       results;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.compactStyle = UVar1;
  FVar2._8_8_ = in_RDX;
  FVar2.fResults = (UFormattedNumberData *)this;
  return FVar2;
}

Assistant:

FormattedNumber LocalizedNumberFormatter::formatDouble(double value, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity.setToDouble(value);
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}